

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  undefined1 local_6f8 [8];
  ResultBuilder resultBuilder;
  TestCaseInfo testInfo;
  SectionStats testCaseSectionStats;
  undefined1 local_120 [8];
  SectionInfo testCaseSection;
  Counts assertions;
  undefined1 auStack_98 [8];
  Totals deltaTotals;
  string local_48;
  allocator local_22;
  allocator local_21;
  
  makeUnexpectedResultBuilder((ResultBuilder *)local_6f8,this);
  resultBuilder.m_data.message.field_2._8_4_ = 0x210;
  std::operator<<((ostream *)(resultBuilder.m_exprComponents.op.field_2._M_local_buf + 8),
                  (string *)message);
  ResultBuilder::captureExpression((ResultBuilder *)local_6f8);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            ((SectionInfo *)local_120,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  testCaseSection.lineInfo.line = 0;
  SectionStats::SectionStats
            ((SectionStats *)&testInfo.properties,(SectionInfo *)local_120,
             (Counts *)&testCaseSection.lineInfo.line,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&testInfo.properties);
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)&resultBuilder.m_shouldDebugBreak,
             &this->m_activeTestCase->super_TestCaseInfo);
  deltaTotals.testCases.failed = 0;
  deltaTotals.assertions.failed = 0;
  deltaTotals.assertions.failedButOk = 0;
  auStack_98 = (undefined1  [8])0x0;
  deltaTotals.assertions.passed = 0;
  deltaTotals.testCases.passed = 1;
  pIVar2 = (this->m_reporter).m_p;
  std::__cxx11::string::string((string *)&local_48,"",&local_22);
  std::__cxx11::string::string((string *)&deltaTotals.testCases.failedButOk,"",&local_21);
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)&testCaseSectionStats.missingAssertions,
             (TestCaseInfo *)&resultBuilder.m_shouldDebugBreak,(Totals *)auStack_98,&local_48,
             (string *)&deltaTotals.testCases.failedButOk,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])
            (pIVar2,&testCaseSectionStats.missingAssertions);
  TestCaseStats::~TestCaseStats((TestCaseStats *)&testCaseSectionStats.missingAssertions);
  std::__cxx11::string::~string((string *)&deltaTotals.testCases.failedButOk);
  std::__cxx11::string::~string((string *)&local_48);
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  std::__cxx11::string::string
            ((string *)&testCaseSectionStats.missingAssertions,"",(allocator *)&local_48);
  testGroupEnded(this,(string *)&testCaseSectionStats.missingAssertions,&this->m_totals,1,1);
  std::__cxx11::string::~string((string *)&testCaseSectionStats.missingAssertions);
  pIVar2 = (this->m_reporter).m_p;
  TestRunStats::TestRunStats
            ((TestRunStats *)&testCaseSectionStats.missingAssertions,&this->m_runInfo,
             &this->m_totals,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])
            (pIVar2,&testCaseSectionStats.missingAssertions);
  TestRunStats::~TestRunStats((TestRunStats *)&testCaseSectionStats.missingAssertions);
  TestCaseInfo::~TestCaseInfo((TestCaseInfo *)&resultBuilder.m_shouldDebugBreak);
  SectionStats::~SectionStats((SectionStats *)&testInfo.properties);
  SectionInfo::~SectionInfo((SectionInfo *)local_120);
  ResultBuilder::~ResultBuilder((ResultBuilder *)local_6f8);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }